

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::Context::Context
          (Context *this,InstanceInterface *vki,DeviceInterface *vkd,VkPhysicalDevice physicalDevice
          ,VkDevice device,VkQueue queue,deUint32 queueFamilyIndex,
          vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
          *queues,ProgramCollection<vk::ProgramBinary> *binaryCollection)

{
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  size_type sVar1;
  const_reference __x;
  ulong local_90;
  size_t queueNdx;
  Move<vk::Handle<(vk::HandleType)24>_> local_78;
  RefData<vk::Handle<(vk::HandleType)24>_> local_58;
  VkQueue local_38;
  VkQueue queue_local;
  VkDevice device_local;
  VkPhysicalDevice physicalDevice_local;
  DeviceInterface *vkd_local;
  InstanceInterface *vki_local;
  Context *this_local;
  
  this->m_vki = vki;
  this->m_vkd = vkd;
  this->m_physicalDevice = physicalDevice;
  this->m_device = device;
  this->m_queue = queue;
  this->m_queueFamilyIndex = queueFamilyIndex;
  local_38 = queue;
  queue_local = (VkQueue)device;
  device_local = (VkDevice)physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vkd;
  vkd_local = (DeviceInterface *)vki;
  vki_local = (InstanceInterface *)this;
  std::
  vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
  ::vector(&this->m_queues,queues);
  ::vk::createCommandPool
            (&local_78,(DeviceInterface *)physicalDevice_local,(VkDevice)queue_local,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_device = local_58.deleter.m_device;
  data.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique(&this->m_commandPool,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_78);
  this->m_binaryCollection = binaryCollection;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_queueFamilies);
  local_90 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
            ::size(&this->m_queues);
    if (sVar1 <= local_90) break;
    __x = std::
          vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
          ::operator[](&this->m_queues,local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_queueFamilies,&__x->first);
    local_90 = local_90 + 1;
  }
  return;
}

Assistant:

Context					(const vk::InstanceInterface&						vki,
																			 const vk::DeviceInterface&							vkd,
																			 vk::VkPhysicalDevice								physicalDevice,
																			 vk::VkDevice										device,
																			 vk::VkQueue										queue,
																			 deUint32											queueFamilyIndex,
																			 const vector<pair<deUint32, vk::VkQueue> >&		queues,
																			 const vk::ProgramCollection<vk::ProgramBinary>&	binaryCollection)
		: m_vki					(vki)
		, m_vkd					(vkd)
		, m_physicalDevice		(physicalDevice)
		, m_device				(device)
		, m_queue				(queue)
		, m_queueFamilyIndex	(queueFamilyIndex)
		, m_queues				(queues)
		, m_commandPool			(createCommandPool(vkd, device, vk::VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex))
		, m_binaryCollection	(binaryCollection)
	{
		for (size_t queueNdx = 0; queueNdx < m_queues.size(); queueNdx++)
			m_queueFamilies.push_back(m_queues[queueNdx].first);
	}